

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall ThreadContext::InvalidateAllPropertyGuards(ThreadContext *this)

{
  Type *this_00;
  int iVar1;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *pWVar2;
  PropertyRecord *propertyRecord;
  RecyclableData *pRVar3;
  long lVar4;
  int i;
  int previous;
  
  pRVar3 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  if (0 < (pRVar3->propertyGuards).count - (pRVar3->propertyGuards).freeCount) {
    this_00 = &pRVar3->propertyGuards;
    if (0 < this_00->size) {
      lVar4 = 0;
      do {
        i = (pRVar3->propertyGuards).buckets.ptr[lVar4];
        if (i != -1) {
          previous = -1;
          do {
            pWVar2 = (pRVar3->propertyGuards).entries.ptr;
            propertyRecord =
                 (PropertyRecord *)((pWVar2[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
            if (propertyRecord == (PropertyRecord *)0x0) {
              iVar1 = pWVar2[i].next;
              JsUtil::
              WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
              ::RemoveEntry(this_00,i,previous,(uint)lVar4);
            }
            else {
              InvalidatePropertyGuardEntry(this,propertyRecord,pWVar2[i].value.ptr,true);
              iVar1 = pWVar2[i].next;
              previous = i;
            }
            i = iVar1;
          } while (i != -1);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < this_00->size);
    }
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
    ::Clear(this_00);
    return;
  }
  return;
}

Assistant:

void
ThreadContext::InvalidateAllPropertyGuards()
{
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;
    if (guards.Count() > 0)
    {
        guards.Map([this](Js::PropertyRecord const * propertyRecord, PropertyGuardEntry* entry, const RecyclerWeakReference<const Js::PropertyRecord>* weakRef)
        {
            InvalidatePropertyGuardEntry(propertyRecord, entry, true);
        });

        guards.Clear();
    }
}